

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocdel1(voccxdef *ctx,objnum objn,char *wrd1,prpnum prp,int really_delete,int revert,
            int keep_undo)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  ushort in_CX;
  long in_RDX;
  short in_SI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  char *orgwrd;
  int do_del;
  int len2;
  int len1;
  char *wrd2;
  int deleted_vocdef;
  uint idx;
  uint nxtidx;
  vocwdef *nxtw;
  vocwdef *prvw;
  vocwdef *vw;
  vocdef **vp;
  vocdef *nxt;
  vocdef *prv;
  vocdef *v;
  int i;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar4;
  char **in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  char **in_stack_ffffffffffffff50;
  vocidef ***wrd;
  vocidef ***pppvVar5;
  long in_stack_ffffffffffffff58;
  voccxdef *in_stack_ffffffffffffff60;
  vocidef ***local_98;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint local_68;
  vocidef ***local_58;
  vocidef ***local_50;
  undefined8 *local_48;
  undefined8 *local_38;
  undefined8 *local_30;
  int local_28;
  
  if (in_RDX != 0) {
    voc_parse_words(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                    (int *)CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  }
  local_28 = 0x100;
  local_48 = (undefined8 *)(in_RDI + 0x670);
  do {
    if (local_28 == 0) {
      return;
    }
    local_38 = (undefined8 *)0x0;
    puVar2 = (undefined8 *)*local_48;
LAB_0028e3d6:
    local_30 = puVar2;
    if (local_30 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*local_30;
      if (in_RDX != 0) {
        if ((*(byte *)(local_30 + 1) != in_stack_ffffffffffffff84) ||
           (iVar3 = memicmp((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88,
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
           iVar3 != 0)) {
          local_38 = local_30;
          goto LAB_0028e3d6;
        }
        if ((in_stack_ffffffffffffff88 != (void *)0x0) &&
           ((*(byte *)((long)local_30 + 9) != in_stack_ffffffffffffff80 ||
            (iVar3 = memicmp((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
            iVar3 != 0)))) {
          local_38 = local_30;
          goto LAB_0028e3d6;
        }
      }
      in_stack_ffffffffffffff94 = 0;
      local_58 = (vocidef ***)0x0;
      local_68 = *(uint *)((long)local_30 + 0xc);
      if (local_68 == 0xffffffff) {
        local_98 = (vocidef ***)0x0;
      }
      else {
        in_stack_ffffffffffffff60 = *(voccxdef **)(in_RDI + 0xe70 + ((ulong)local_68 / 2000) * 8);
        local_98 = in_stack_ffffffffffffff60->voccxinh + ((ulong)local_68 % 2000 - 0xb);
        in_stack_ffffffffffffff58 = in_RDI;
      }
      local_50 = local_98;
      while (local_50 != (vocidef ***)0x0) {
        uVar1 = *(uint *)local_50;
        if (uVar1 == 0xffffffff) {
          wrd = (vocidef ***)0x0;
        }
        else {
          wrd = (vocidef ***)
                (*(long *)(in_RDI + 0xe70 + ((ulong)uVar1 / 2000) * 8) + ((ulong)uVar1 % 2000) * 8);
        }
        pppvVar5 = wrd;
        if (in_R9D == 0) {
          bVar4 = false;
          if ((*(short *)((long)local_50 + 4) == in_SI) && (bVar4 = true, in_RDX != 0)) {
            bVar4 = *(byte *)((long)local_50 + 6) == in_CX;
          }
          if ((((bool)bVar4 != false) && (in_R8D == 0)) &&
             (((ulong)*local_50 & 0x400000000000000) == 0)) {
            if ((in_stack_00000008 != 0) && (in_RDX != 0)) {
              vocdusave_delwrd(in_stack_ffffffffffffff60,
                               (objnum)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                               (prpnum)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                               (int)in_stack_ffffffffffffff58,(char *)wrd);
            }
            *(byte *)((long)local_50 + 7) = *(byte *)((long)local_50 + 7) | 8;
            bVar4 = 0;
          }
        }
        else {
          bVar4 = *(byte *)((long)local_50 + 7) & 4;
          *(byte *)((long)local_50 + 7) = *(byte *)((long)local_50 + 7) & 0xf7;
        }
        if (bVar4 == 0) {
          local_58 = local_50;
          local_68 = uVar1;
          local_50 = wrd;
        }
        else {
          if ((in_stack_00000008 != 0) && (in_RDX != 0)) {
            vocdusave_delwrd(in_stack_ffffffffffffff60,
                             (objnum)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                             (prpnum)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                             (int)in_stack_ffffffffffffff58,(char *)pppvVar5);
          }
          if (local_58 == (vocidef ***)0x0) {
            *(uint *)((long)local_30 + 0xc) = *(uint *)local_50;
          }
          else {
            *(uint *)local_58 = *(uint *)local_50;
          }
          *(uint *)local_50 = *(uint *)(in_RDI + 0xef4);
          *(uint *)(in_RDI + 0xef4) = local_68;
          local_68 = uVar1;
          local_50 = wrd;
          if (*(int *)((long)local_30 + 0xc) == -1) {
            if (local_38 == (undefined8 *)0x0) {
              *local_48 = *local_30;
            }
            else {
              *local_38 = *local_30;
            }
            *local_30 = *(undefined8 *)(in_RDI + 0x30);
            *(undefined8 **)(in_RDI + 0x30) = local_30;
            in_stack_ffffffffffffff94 = 1;
          }
        }
      }
      if (in_stack_ffffffffffffff94 == 0) {
        local_38 = local_30;
      }
      goto LAB_0028e3d6;
    }
    local_48 = local_48 + 1;
    local_28 = local_28 + -1;
  } while( true );
}

Assistant:

void vocdel1(voccxdef *ctx, objnum objn, char *wrd1, prpnum prp,
             int really_delete, int revert, int keep_undo)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      nxtidx;
    uint      idx;
    int       deleted_vocdef;
    char     *wrd2;
    int       len1, len2;
    int       do_del;
    char     *orgwrd;

    /* parse the word if provided */
    orgwrd = wrd1;
    if (wrd1)
        voc_parse_words(&wrd1, &len1, &wrd2, &len2);
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            /* remember next word in hash chain */
            nxt = v->vocnxt;

            /* if this word doesn't match, skip it */
            if (wrd1)
            {
                /* compare the first word */
                if (v->voclen != len1
                    || memicmp((char *)v->voctxt, wrd1, (size_t)len1))
                {
                    prv = v;
                    continue;
                }

                /* if there's a second word, compare it as well */
                if (wrd2 && (v->vocln2 != len2
                             || memicmp((char *)v->voctxt + len1,
                                        wrd2, (size_t)len2)))
                {
                    prv = v;
                    continue;
                }
            }

            /* presume we're not going to delete this vocdef */
            deleted_vocdef = FALSE;
            
            /* go through all object relations for this word */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember next word in relation list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /*
                 *   figure out whether to delete this word, based on the
                 *   caller's specified operating mode 
                 */
                if (revert)
                {
                    /* if reverting, delete all new words */
                    do_del = (vw->vocwflg & VOCFNEW);

                    /* also, remove the DELETED flag if present */
                    vw->vocwflg &= ~VOCFDEL;
                }
                else
                {
                    /*
                     *   delete the word if the object number matches,
                     *   AND either we're not searching for a specific
                     *   vocabulary word (in which case wrd1 will be null)
                     *   or the word matches the vocabulary word we're
                     *   seeking (in which case the part of speech must
                     *   match) 
                     */
                    do_del = (vw->vocwobj == objn
                              && (wrd1 == 0 || vw->vocwtyp == prp));

                    /*
                     *   if we're not in really_delete mode, and the word
                     *   matches and it wasn't dynamically added at
                     *   run-time, simply mark it as deleted -- this will
                     *   allow it to be undeleted if the game is reverted
                     *   to RESTART conditions 
                     */
                    if (do_del && !really_delete && !(vw->vocwflg & VOCFNEW))
                    {
                        /* geneate undo for the operation */
                        if (keep_undo && orgwrd)
                            vocdusave_delwrd(ctx, objn, prp,
                                             vw->vocwflg, orgwrd);
                        
                        /* just mark the word for deletion, but keep vw */
                        vw->vocwflg |= VOCFDEL;
                        do_del = FALSE;
                    }
                }

                /* now delete the structure if we decided we should */
                if (do_del)
                {
                    /* geneate undo for the operation */
                    if (keep_undo && orgwrd)
                        vocdusave_delwrd(ctx, objn, prp, vw->vocwflg, orgwrd);
                                         
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the entire vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                    
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                {
                    /* we're not deleting the word, so move prvw forward */
                    prvw = vw;
                }
            }

            /* if we didn't delete this vocdef, move prv forward onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}